

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int curve_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
               t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  int iVar1;
  t_float tVar2;
  t_float tVar3;
  t_float tVar4;
  t_float tVar5;
  int local_80;
  int local_7c;
  int yerr;
  int xerr;
  int yloc;
  int yval;
  int xloc;
  int xval;
  _fielddesc *f;
  int besterror;
  int bestn;
  int n;
  int i;
  t_curve *x;
  t_float basey_local;
  t_float basex_local;
  _array *ap_local;
  t_scalar *sc_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  iVar1 = *(int *)&z[0xd].g_next;
  f._4_4_ = -1;
  f._0_4_ = 0x7fffffff;
  if ((((ulong)z[3].g_pd & 4) == 0) && (((ulong)z[3].g_pd & 0x10) == 0)) {
    tVar2 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
    if ((tVar2 != 0.0) || (NAN(tVar2))) {
      bestn = 0;
      _xloc = z[0xe].g_pd;
      for (; bestn < iVar1; bestn = bestn + 1) {
        tVar2 = fielddesc_getcoord((_fielddesc *)_xloc,template,data,0);
        tVar3 = glist_xtopixels(glist,basex + (float)(int)tVar2);
        tVar4 = fielddesc_getcoord((_fielddesc *)&_xloc->c_nmethod,template,data,0);
        tVar5 = glist_ytopixels(glist,basey + (float)(int)tVar4);
        local_7c = (int)tVar3 - xpix;
        local_80 = (int)tVar5 - ypix;
        if ((*(undefined1 *)((long)&_xloc->c_name + 1) != '\0') ||
           (*(undefined1 *)((long)&_xloc->c_nmethod + 1) != '\0')) {
          if (local_7c < 0) {
            local_7c = -local_7c;
          }
          if (local_80 < 0) {
            local_80 = -local_80;
          }
          if (local_7c < local_80) {
            local_7c = local_80;
          }
          if (local_7c < (int)f) {
            *(float *)((pd_maininstance.pd_gui)->i_template + 8) = (float)(int)tVar2;
            *(float *)((pd_maininstance.pd_gui)->i_template + 0x14) = (float)(int)tVar4;
            f._0_4_ = local_7c;
            f._4_4_ = bestn;
          }
        }
        _xloc = (t_pd)&_xloc->c_symbolmethod;
      }
      if (6 < (int)f) {
        return 0;
      }
      if (doit != 0) {
        tVar2 = glist_pixelstox(glist,1.0);
        tVar3 = glist_pixelstox(glist,0.0);
        *(float *)((pd_maininstance.pd_gui)->i_template + 0xc) = tVar2 - tVar3;
        tVar2 = glist_pixelstoy(glist,1.0);
        tVar3 = glist_pixelstoy(glist,0.0);
        *(float *)((pd_maininstance.pd_gui)->i_template + 0x18) = tVar2 - tVar3;
        *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 4) = 0;
        *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0x10) = 0;
        *(_glist **)((pd_maininstance.pd_gui)->i_template + 0x20) = glist;
        *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0x28) = sc;
        *(_array **)((pd_maininstance.pd_gui)->i_template + 0x30) = ap;
        *(t_word **)((pd_maininstance.pd_gui)->i_template + 0x38) = data;
        *(int *)(pd_maininstance.pd_gui)->i_template = f._4_4_ << 1;
        *(t_template **)((pd_maininstance.pd_gui)->i_template + 0x40) = template;
        if (*(long *)((pd_maininstance.pd_gui)->i_template + 0x28) == 0) {
          gpointer_setarray((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0x48),
                            *(_array **)((pd_maininstance.pd_gui)->i_template + 0x30),
                            *(t_word **)((pd_maininstance.pd_gui)->i_template + 0x38));
        }
        else {
          gpointer_setglist((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0x48),
                            *(_glist **)((pd_maininstance.pd_gui)->i_template + 0x20),
                            *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0x28));
        }
        glist_grab(glist,z,curve_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int curve_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    int bestn = -1;
    int besterror = 0x7fffffff;
    t_fielddesc *f;
    if ((x->x_flags & NOMOUSERUN) || (x->x_flags & NOVERTICES) ||
        !fielddesc_getfloat(&x->x_vis, template, data, 0))
            return (0);
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xval = fielddesc_getcoord(f, template, data, 0),
            xloc = glist_xtopixels(glist, basex + xval);
        int yval = fielddesc_getcoord(f+1, template, data, 0),
            yloc = glist_ytopixels(glist, basey + yval);
        int xerr = xloc - xpix, yerr = yloc - ypix;
        if (!f->fd_var && !(f+1)->fd_var)
            continue;
        if (xerr < 0)
            xerr = -xerr;
        if (yerr < 0)
            yerr = -yerr;
        if (yerr > xerr)
            xerr = yerr;
        if (xerr < besterror)
        {
            TEMPLATE->curve_motion_xbase = xval;
            TEMPLATE->curve_motion_ybase = yval;
            besterror = xerr;
            bestn = i;
        }
    }
    if (besterror > 6)
        return (0);
    if (doit)
    {
        TEMPLATE->curve_motion_xper = glist_pixelstox(glist, 1)
            - glist_pixelstox(glist, 0);
        TEMPLATE->curve_motion_yper = glist_pixelstoy(glist, 1)
            - glist_pixelstoy(glist, 0);
        TEMPLATE->curve_motion_xcumulative = 0;
        TEMPLATE->curve_motion_ycumulative = 0;
        TEMPLATE->curve_motion_glist = glist;
        TEMPLATE->curve_motion_scalar = sc;
        TEMPLATE->curve_motion_array = ap;
        TEMPLATE->curve_motion_wp = data;
        TEMPLATE->curve_motion_field = 2*bestn;
        TEMPLATE->curve_motion_template = template;
        if (TEMPLATE->curve_motion_scalar)
            gpointer_setglist(&TEMPLATE->curve_motion_gpointer,
                TEMPLATE->curve_motion_glist, TEMPLATE->curve_motion_scalar);
        else gpointer_setarray(&TEMPLATE->curve_motion_gpointer,
                TEMPLATE->curve_motion_array, TEMPLATE->curve_motion_wp);
        glist_grab(glist, z, curve_motionfn, 0, xpix, ypix);
    }
    return (1);
}